

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyHttpImplPrivate::followRedirect(QNetworkReplyHttpImplPrivate *this)

{
  QNetworkHeadersPrivate *this_00;
  QNetworkReplyHttpImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QDecompressHelper *unaff_retaddr;
  QNetworkReplyHttpImpl *q;
  QNetworkReplyHttpImplPrivate *signal;
  QObject *in_stack_fffffffffffffff0;
  ContextType *object;
  
  object = *(ContextType **)(in_FS_OFFSET + 0x28);
  signal = in_RDI;
  this_00 = (QNetworkHeadersPrivate *)q_func(in_RDI);
  QDecompressHelper::clear(unaff_retaddr);
  QNetworkHeadersPrivate::clearHeaders(this_00);
  if (in_RDI->managerPrivate->thread != (QThread *)0x0) {
    QObject::disconnect(in_stack_fffffffffffffff0,(char *)signal,(QObject *)this_00,(char *)in_RDI);
  }
  QMetaObject::invokeMethod<QNetworkReplyHttpImplPrivate::followRedirect()::__0>
            (object,(anon_class_8_1_8991fb9c_for_o *)in_RDI,(ConnectionType)((ulong)signal >> 0x20))
  ;
  if (*(ContextType **)(in_FS_OFFSET + 0x28) == object) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::followRedirect()
{
    Q_Q(QNetworkReplyHttpImpl);
    Q_ASSERT(managerPrivate);

    decompressHelper.clear();
    clearHeaders();

    if (managerPrivate->thread)
        managerPrivate->thread->disconnect();

    QMetaObject::invokeMethod(
            q, [this]() { postRequest(redirectRequest); }, Qt::QueuedConnection);
}